

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VtabMakeWritable(Parse *pParse,Table *pTab)

{
  int iVar1;
  Table **ppTVar2;
  long lVar3;
  Parse *pPVar4;
  
  pPVar4 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar4 = pParse;
  }
  iVar1 = pPVar4->nVtabLock;
  if (0 < (long)iVar1) {
    lVar3 = 0;
    do {
      if (pPVar4->apVtabLock[lVar3] == pTab) {
        return;
      }
      lVar3 = lVar3 + 1;
    } while (iVar1 != lVar3);
  }
  ppTVar2 = (Table **)sqlite3Realloc(pPVar4->apVtabLock,(long)(iVar1 * 8 + 8));
  if (ppTVar2 != (Table **)0x0) {
    pPVar4->apVtabLock = ppTVar2;
    iVar1 = pPVar4->nVtabLock;
    pPVar4->nVtabLock = iVar1 + 1;
    ppTVar2[iVar1] = pTab;
    return;
  }
  sqlite3OomFault(pPVar4->db);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabMakeWritable(Parse *pParse, Table *pTab){
  Parse *pToplevel = sqlite3ParseToplevel(pParse);
  int i, n;
  Table **apVtabLock;

  assert( IsVirtual(pTab) );
  for(i=0; i<pToplevel->nVtabLock; i++){
    if( pTab==pToplevel->apVtabLock[i] ) return;
  }
  n = (pToplevel->nVtabLock+1)*sizeof(pToplevel->apVtabLock[0]);
  apVtabLock = sqlite3Realloc(pToplevel->apVtabLock, n);
  if( apVtabLock ){
    pToplevel->apVtabLock = apVtabLock;
    pToplevel->apVtabLock[pToplevel->nVtabLock++] = pTab;
  }else{
    sqlite3OomFault(pToplevel->db);
  }
}